

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O1

int transfer_set_message_format(TRANSFER_HANDLE transfer,message_format message_format_value)

{
  int iVar1;
  AMQP_VALUE item_value;
  int iVar2;
  TRANSFER_INSTANCE *transfer_instance;
  
  if (transfer == (TRANSFER_HANDLE)0x0) {
    iVar2 = 0x1d92;
  }
  else {
    item_value = amqpvalue_create_uint(message_format_value);
    if (item_value == (AMQP_VALUE)0x0) {
      iVar2 = 0x1d9a;
    }
    else {
      iVar1 = amqpvalue_set_composite_item(transfer->composite_value,3,item_value);
      iVar2 = 0x1da0;
      if (iVar1 == 0) {
        iVar2 = 0;
      }
      amqpvalue_destroy(item_value);
    }
  }
  return iVar2;
}

Assistant:

int transfer_set_message_format(TRANSFER_HANDLE transfer, message_format message_format_value)
{
    int result;

    if (transfer == NULL)
    {
        result = MU_FAILURE;
    }
    else
    {
        TRANSFER_INSTANCE* transfer_instance = (TRANSFER_INSTANCE*)transfer;
        AMQP_VALUE message_format_amqp_value = amqpvalue_create_message_format(message_format_value);
        if (message_format_amqp_value == NULL)
        {
            result = MU_FAILURE;
        }
        else
        {
            if (amqpvalue_set_composite_item(transfer_instance->composite_value, 3, message_format_amqp_value) != 0)
            {
                result = MU_FAILURE;
            }
            else
            {
                result = 0;
            }

            amqpvalue_destroy(message_format_amqp_value);
        }
    }

    return result;
}